

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O1

string * __thiscall
juzzlin::SimpleLogger::Impl::currentDateTime
          (string *__return_storage_ptr__,Impl *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          now,string *dateTimeFormat)

{
  tm *ptVar1;
  _Put_time<char> __f;
  time_t rawTime;
  ostringstream oss;
  long local_1a0;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1a0 = (long)now.__d.__r / 1000000000;
  ptVar1 = localtime(&local_1a0);
  __f._M_fmt = (dateTimeFormat->_M_dataplus)._M_p;
  __f._M_tmb = (tm *)ptVar1;
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_198,__f);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string SimpleLogger::Impl::currentDateTime(std::chrono::time_point<std::chrono::system_clock> now, const std::string & dateTimeFormat) const
{
    std::ostringstream oss;
    const auto rawTime = std::chrono::system_clock::to_time_t(now);
    oss << std::put_time(std::localtime(&rawTime), dateTimeFormat.c_str());

    return oss.str();
}